

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int NeedEQU(void)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = lp;
  SkipBlanks();
  if (*lp == '.') {
    lp = lp + 1;
  }
  iVar2 = cmphstr(&lp,"equ",false);
  if (iVar2 != 0) {
    pcVar1 = lp;
  }
  lp = pcVar1;
  return (uint)(iVar2 != 0);
}

Assistant:

int NeedEQU() {
	char* olp = lp;
	SkipBlanks();
	/*if (*lp=='=') { ++lp; return 1; }*/
	/* cut: if (*lp=='=') { ++lp; return 1; } */
	if (*lp == '.') {
		++lp;
	}
	if (cmphstr(lp, "equ")) {
		return 1;
	}
	lp = olp;
	return 0;
}